

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

int run_test_fork_socketpair_started(void)

{
  int iVar1;
  __pid_t child_pid_00;
  uint uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  uv_loop_t *loop;
  undefined1 local_c0 [8];
  uv_poll_t poll_handle;
  int iStack_18;
  char sync_buf [1];
  int sync_pipe [2];
  int socket_fds [2];
  pid_t child_pid;
  
  iVar1 = pipe((int *)&poll_handle.io_watcher.field_0x34);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xa6,"0 == pipe(sync_pipe)");
    abort();
  }
  run_timer_loop_once();
  iVar1 = socketpair(1,1,0,sync_pipe);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xab,"0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds)");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_poll_init(uVar3,local_c0,sync_pipe[0]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xae,"0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0])");
    abort();
  }
  iVar1 = uv_poll_start(local_c0,1,socket_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xaf,"0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb)");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_run(uVar3,2);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xb5,"1 == uv_run(uv_default_loop(), UV_RUN_NOWAIT)");
    abort();
  }
  child_pid_00 = fork();
  if (child_pid_00 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0xb8,"child_pid != -1");
    abort();
  }
  if (child_pid_00 == 0) {
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    sVar4 = read(poll_handle.io_watcher._52_4_,(void *)((long)&poll_handle.io_watcher.fd + 3),1);
    if (sVar4 != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xca,"1 == read(sync_pipe[0], sync_buf, 1)");
      abort();
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar3);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xcb,"0 == uv_loop_fork(uv_default_loop())");
      abort();
    }
    if (socket_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xcc,"0 == socket_cb_called");
      abort();
    }
    printf("Going to run the loop in the child\n");
    socket_cb_read_fd = sync_pipe[0];
    socket_cb_read_size = 3;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xd1,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
      abort();
    }
    if (socket_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xd2,"1 == socket_cb_called");
      abort();
    }
    printf("Buf %s\n",socket_cb_read_buf);
    iVar1 = strcmp("hi\n",socket_cb_read_buf);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xd4,"0 == strcmp(\"hi\\n\", socket_cb_read_buf)");
      abort();
    }
  }
  else {
    iVar1 = uv_poll_stop(local_c0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xbc,"0 == uv_poll_stop(&poll_handle)");
      abort();
    }
    uv_close(local_c0,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xbe,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
      abort();
    }
    if (socket_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xbf,"0 == socket_cb_called");
      abort();
    }
    sVar4 = write(iStack_18,"1",1);
    if (sVar4 != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xc0,"1 == write(sync_pipe[1], \"1\", 1)");
      abort();
    }
    sVar4 = send(sync_pipe[1],"hi\n",3,0);
    if (sVar4 != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xc1,"3 == send(socket_fds[1], \"hi\\n\", 3, 0)");
      abort();
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xc3,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
      abort();
    }
    if (socket_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0xc4,"0 == socket_cb_called");
      abort();
    }
    assert_wait_child(child_pid_00);
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,0xd7,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(fork_socketpair_started) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork, even if the watcher was already
     started, and then stopped in the parent. */
  pid_t child_pid;
  int socket_fds[2];
  int sync_pipe[2];
  char sync_buf[1];
  uv_poll_t poll_handle;

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create and start the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));

  /* Run the loop AFTER the poll watcher is registered to make sure it
     gets passed to the kernel. Use NOWAIT and expect a non-zero
     return to prove the poll watcher is active.
  */
  ASSERT(1 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(0 == uv_poll_stop(&poll_handle));
    uv_close((uv_handle_t*)&poll_handle, NULL);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(0 == socket_cb_called);
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert child */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));

    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(0 == socket_cb_called);

    assert_wait_child(child_pid);
  } else {
    /* child */
    printf("Child is %d\n", getpid());
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for parent */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);

    printf("Going to run the loop in the child\n");
    socket_cb_read_fd = socket_fds[0];
    socket_cb_read_size = 3;
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
    printf("Buf %s\n", socket_cb_read_buf);
    ASSERT(0 == strcmp("hi\n", socket_cb_read_buf));
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}